

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literals * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::callExport
          (Literals *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Name name,
          Literals *arguments)

{
  Name name_00;
  Name *pNVar1;
  Name NVar2;
  Literals local_90;
  size_t local_58;
  char *pcStack_50;
  ModuleRunnerBase<wasm::ModuleRunner> *local_48;
  char *local_40;
  Export *local_38;
  Export *export_;
  Literals *arguments_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Name name_local;
  
  local_40 = name.super_IString.str._M_str;
  local_48 = name.super_IString.str._M_len;
  NVar2.super_IString.str._M_str = (char *)local_48;
  NVar2.super_IString.str._M_len = (size_t)this->wasm;
  export_ = (Export *)arguments;
  arguments_local = (Literals *)this;
  this_local = local_48;
  name_local.super_IString.str._M_len = (size_t)local_40;
  name_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  local_38 = (Export *)::wasm::Module::getExportOrNull(NVar2);
  if ((local_38 == (Export *)0x0) || (local_38->kind != Function)) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"callExport not found");
  }
  pNVar1 = Export::getInternalName(local_38);
  local_58 = (pNVar1->super_IString).str._M_len;
  pcStack_50 = (pNVar1->super_IString).str._M_str;
  Literals::Literals(&local_90,(Literals *)export_);
  name_00.super_IString.str._M_str = pcStack_50;
  name_00.super_IString.str._M_len = local_58;
  callFunction(__return_storage_ptr__,this,name_00,&local_90);
  Literals::~Literals(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Literals callExport(Name name, const Literals& arguments) {
    Export* export_ = wasm.getExportOrNull(name);
    if (!export_ || export_->kind != ExternalKind::Function) {
      externalInterface->trap("callExport not found");
    }
    return callFunction(*export_->getInternalName(), arguments);
  }